

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonBlobAppendNode(JsonParse *pParse,u8 eType,u32 szPayload,void *aPayload)

{
  u8 *puVar1;
  int iVar2;
  uint uVar3;
  u8 uVar4;
  u8 uVar5;
  
  uVar3 = pParse->nBlob;
  if (pParse->nBlobAlloc < szPayload + uVar3 + 9) {
    jsonBlobExpandAndAppendNode(pParse,eType,szPayload,aPayload);
    return;
  }
  puVar1 = pParse->aBlob;
  uVar5 = (u8)szPayload;
  if (szPayload < 0xc) {
    puVar1[uVar3] = uVar5 << 4 | eType;
    iVar2 = 1;
  }
  else if (szPayload < 0x100) {
    puVar1[uVar3] = eType | 0xc0;
    puVar1[(ulong)uVar3 + 1] = uVar5;
    iVar2 = 2;
  }
  else {
    uVar4 = (u8)(szPayload >> 8);
    if (szPayload < 0x10000) {
      puVar1[uVar3] = eType | 0xd0;
      puVar1[(ulong)uVar3 + 1] = uVar4;
      puVar1[(ulong)uVar3 + 2] = uVar5;
      iVar2 = 3;
    }
    else {
      puVar1[uVar3] = eType | 0xe0;
      puVar1[(ulong)uVar3 + 1] = (u8)(szPayload >> 0x18);
      puVar1[(ulong)uVar3 + 2] = (u8)(szPayload >> 0x10);
      puVar1[(ulong)uVar3 + 3] = uVar4;
      puVar1[(ulong)uVar3 + 4] = uVar5;
      iVar2 = 5;
    }
  }
  uVar3 = iVar2 + pParse->nBlob;
  pParse->nBlob = uVar3;
  if (aPayload != (void *)0x0) {
    pParse->nBlob = uVar3 + szPayload;
    memcpy(pParse->aBlob + uVar3,aPayload,(ulong)szPayload);
    return;
  }
  return;
}

Assistant:

static void jsonBlobAppendNode(
  JsonParse *pParse,          /* The JsonParse object under construction */
  u8 eType,                   /* Node type.  One of JSONB_* */
  u32 szPayload,              /* Number of bytes of payload */
  const void *aPayload        /* The payload.  Might be NULL */
){
  u8 *a;
  if( pParse->nBlob+szPayload+9 > pParse->nBlobAlloc ){
    jsonBlobExpandAndAppendNode(pParse,eType,szPayload,aPayload);
    return;
  }
  assert( pParse->aBlob!=0 );
  a = &pParse->aBlob[pParse->nBlob];
  if( szPayload<=11 ){
    a[0] = eType | (szPayload<<4);
    pParse->nBlob += 1;
  }else if( szPayload<=0xff ){
    a[0] = eType | 0xc0;
    a[1] = szPayload & 0xff;
    pParse->nBlob += 2;
  }else if( szPayload<=0xffff ){
    a[0] = eType | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
    pParse->nBlob += 3;
  }else{
    a[0] = eType | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
    pParse->nBlob += 5;
  }
  if( aPayload ){
    pParse->nBlob += szPayload;
    memcpy(&pParse->aBlob[pParse->nBlob-szPayload], aPayload, szPayload);
  }
}